

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O3

test_result * __thiscall
ut::test_case_impl<agge::tests::BitmapTests>::execute
          (test_result *__return_storage_ptr__,test_case_impl<agge::tests::BitmapTests> *this)

{
  setup_impl<agge::tests::BitmapTests> *psVar1;
  code *pcVar2;
  char *pcVar3;
  ulong *puVar4;
  string outcome;
  BitmapTests f;
  BitmapTests local_3b;
  
  agge::tests::BitmapTests::BitmapTests(&local_3b);
  psVar1 = (this->_setup)._ptr;
  for (puVar4 = (psVar1->_inits).
                super__Vector_base<void_(agge::tests::BitmapTests::*)(),_std::allocator<void_(agge::tests::BitmapTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (psVar1->_inits).
                super__Vector_base<void_(agge::tests::BitmapTests::*)(),_std::allocator<void_(agge::tests::BitmapTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 2) {
    pcVar2 = (code *)*puVar4;
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)(&local_3b.field_0x0 + puVar4[1]) + -1);
    }
    (*pcVar2)();
  }
  pcVar2 = (code *)this->_method;
  if (((ulong)pcVar2 & 1) != 0) {
    pcVar2 = *(code **)(pcVar2 + *(long *)(&local_3b.field_0x0 + *(long *)&this->field_0x10) + -1);
  }
  (*pcVar2)();
  psVar1 = (this->_setup)._ptr;
  for (puVar4 = (psVar1->_teardowns).
                super__Vector_base<void_(agge::tests::BitmapTests::*)(),_std::allocator<void_(agge::tests::BitmapTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (psVar1->_teardowns).
                super__Vector_base<void_(agge::tests::BitmapTests::*)(),_std::allocator<void_(agge::tests::BitmapTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 2) {
    pcVar2 = (code *)*puVar4;
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)(&local_3b.field_0x0 + puVar4[1]) + -1);
    }
    (*pcVar2)();
  }
  *(byte *)__return_storage_ptr__ = *(byte *)__return_storage_ptr__ & 0xf8 | 7;
  pcVar3 = (char *)operator_new__(1);
  (__return_storage_ptr__->outcome)._text = pcVar3;
  *pcVar3 = '\0';
  (__return_storage_ptr__->outcome)._deleter = exportable::immutable_basic_string<char>::deallocate;
  return __return_storage_ptr__;
}

Assistant:

inline test_result test_case_impl<Fixture>::execute()
	{
		bool initialized = false;
		bool passed = false;
		bool terminated = false;
		std::string outcome;

		try
		{
			Fixture f;

			try
			{
				_setup->init(f);
				initialized = true;

				try
				{
					(f.*_method)();
					passed = true;
				}
				catch (const std::exception &e)
				{
					outcome = e.what();
				}
				catch (...)
				{
					outcome = "Test Failed!";
				}

				try
				{
					_setup->teardown(f);
					terminated = true;
				}
				catch (const std::exception &e)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += std::string("Teardown Failed: ") + e.what();
				}
				catch (...)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += "Teardown Failed!";
				}
			}
			catch (const std::exception &e)
			{
				outcome = std::string("Initialization Failed: ") + e.what();
			}
			catch (...)
			{
				outcome = "Initialization Failed!";
			}
		}
		catch (...)
		{
		}
		return test_result(initialized, passed, terminated, outcome);
	}